

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::deinit
          (FeedbackRecordVariableSelectionCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  if (this->m_xfbBuf != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_xfbBuf);
    this->m_xfbBuf = 0;
  }
  return;
}

Assistant:

void FeedbackRecordVariableSelectionCase::deinit (void)
{
	delete m_program;
	m_program = DE_NULL;

	if (m_xfbBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_xfbBuf);
		m_xfbBuf = 0;
	}
}